

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bicg.h
# Opt level: O2

int BiCG<TPZMatrix<long_double>,TPZFMatrix<long_double>,TPZMatrixSolver<long_double>,double>
              (TPZMatrix<long_double> *A,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *b,
              TPZMatrixSolver<long_double> *M,int64_t *max_iter,double *tol)

{
  int iVar1;
  TPZFMatrix<long_double> *pTVar2;
  TPZFMatrix<long_double> *pTVar3;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar5;
  longdouble lVar6;
  longdouble in_ST6;
  longdouble in_ST7;
  ulong uVar7;
  double dVar8;
  double dVar9;
  TPZFMatrix<long_double> r;
  TPZFMatrix<long_double> rtilde;
  TPZFMatrix<long_double> ptilde;
  TPZFMatrix<long_double> p;
  TPZFMatrix<long_double> z;
  TPZFMatrix<long_double> ztilde;
  TPZFMatrix<long_double> alpha;
  TPZFMatrix<long_double> rho_1;
  TPZFMatrix<long_double> local_300;
  TPZFMatrix<long_double> qtilde;
  TPZFMatrix<long_double> beta;
  TPZFMatrix<long_double> rho_2;
  TPZFMatrix<long_double> q;
  
  TPZFMatrix<long_double>::TPZFMatrix(&rho_1,1,1);
  TPZFMatrix<long_double>::TPZFMatrix(&rho_2,1,1);
  TPZFMatrix<long_double>::TPZFMatrix(&alpha,1,1);
  pTVar2 = (TPZFMatrix<long_double> *)0x1;
  pTVar3 = pTVar2;
  TPZFMatrix<long_double>::TPZFMatrix(&beta,1,1);
  TPZFMatrix<long_double>::TPZFMatrix(&z);
  TPZFMatrix<long_double>::TPZFMatrix(&ztilde);
  TPZFMatrix<long_double>::TPZFMatrix(&p);
  TPZFMatrix<long_double>::TPZFMatrix(&ptilde);
  TPZFMatrix<long_double>::TPZFMatrix(&q);
  TPZFMatrix<long_double>::TPZFMatrix(&qtilde);
  Norm((longdouble *)b,pTVar3);
  lVar5 = in_ST7;
  TPZMatrix<long_double>::operator*(&rtilde,A,x);
  TPZFMatrix<long_double>::operator-(&r,b,&rtilde);
  TPZFMatrix<long_double>::~TPZFMatrix(&rtilde);
  pTVar3 = &r;
  TPZFMatrix<long_double>::TPZFMatrix(&rtilde,pTVar3);
  Norm((longdouble *)&r,pTVar3);
  uVar7 = -(ulong)((double)in_ST0 == 0.0);
  dVar9 = (double)(~uVar7 & (ulong)(double)in_ST0 | uVar7 & 0x3ff0000000000000);
  dVar8 = (double)(-(ulong)((double)in_ST1 / dVar9 <= *tol) & 0x3ff0000000000000);
  if (*tol < (double)in_ST1 / dVar9) {
    for (; (long)pTVar2 <= *max_iter;
        pTVar2 = (TPZFMatrix<long_double> *)
                 ((long)&(pTVar2->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable
                         ._vptr_TPZSavable + 1)) {
      (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&r,&z,0);
      (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&rtilde,&ztilde,0);
      pTVar3 = &rtilde;
      Dot<long_double>(&z,&rtilde);
      *rho_1.fElem = in_ST2;
      if (((double)in_ST2 == 0.0) && (!NAN((double)in_ST2))) {
        Norm((longdouble *)&r,pTVar3);
        *tol = (double)in_ST3 / dVar9;
        *max_iter = (int64_t)pTVar2;
        iVar1 = 2;
        goto LAB_00cfd950;
      }
      lVar6 = lVar5;
      if (pTVar2 == (TPZFMatrix<long_double> *)0x1) {
        TPZFMatrix<long_double>::operator=(&p,&z);
        TPZFMatrix<long_double>::operator=(&ptilde,&ztilde);
        lVar4 = in_ST4;
        in_ST2 = in_ST5;
        in_ST4 = in_ST7;
        in_ST5 = lVar5;
      }
      else {
        lVar4 = *rho_2.fElem;
        *beta.fElem = in_ST2 / lVar4;
        TPZFMatrix<long_double>::TimesBetaPlusZ(&p,in_ST2 / lVar4,&z);
        TPZFMatrix<long_double>::TimesBetaPlusZ(&ptilde,*beta.fElem,&ztilde);
        lVar4 = in_ST4;
        in_ST2 = in_ST5;
        in_ST4 = in_ST7;
        in_ST5 = lVar5;
      }
      TPZMatrix<long_double>::operator*(&local_300,A,&p);
      TPZFMatrix<long_double>::operator=(&q,&local_300);
      TPZFMatrix<long_double>::~TPZFMatrix(&local_300);
      (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])(A,&ptilde,&qtilde);
      lVar5 = *rho_1.fElem;
      Dot<long_double>(&ptilde,&q);
      *alpha.fElem = lVar5 / in_ST3;
      in_ST7 = lVar6;
      TPZFMatrix<long_double>::operator*(&local_300,&p,lVar5 / in_ST3);
      TPZFMatrix<long_double>::operator+=(x,&local_300.super_TPZMatrix<long_double>);
      TPZFMatrix<long_double>::~TPZFMatrix(&local_300);
      TPZFMatrix<long_double>::operator*(&local_300,&q,*alpha.fElem);
      TPZFMatrix<long_double>::operator-=(&r,&local_300.super_TPZMatrix<long_double>);
      TPZFMatrix<long_double>::~TPZFMatrix(&local_300);
      TPZFMatrix<long_double>::operator*(&local_300,&qtilde,*alpha.fElem);
      pTVar3 = &local_300;
      TPZFMatrix<long_double>::operator-=(&rtilde,&local_300.super_TPZMatrix<long_double>);
      TPZFMatrix<long_double>::~TPZFMatrix(&local_300);
      *rho_2.fElem = *rho_1.fElem;
      in_ST3 = in_ST6;
      in_ST6 = lVar6;
      lVar5 = in_ST7;
      Norm((longdouble *)&r,pTVar3);
      dVar8 = (double)lVar4 / dVar9;
      if (dVar8 < *tol) {
        *tol = dVar8;
        *max_iter = (int64_t)pTVar2;
        goto LAB_00cfd94e;
      }
    }
    *tol = dVar8;
    iVar1 = 1;
  }
  else {
    *tol = dVar8;
    *max_iter = 0;
LAB_00cfd94e:
    iVar1 = 0;
  }
LAB_00cfd950:
  TPZFMatrix<long_double>::~TPZFMatrix(&rtilde);
  TPZFMatrix<long_double>::~TPZFMatrix(&r);
  TPZFMatrix<long_double>::~TPZFMatrix(&qtilde);
  TPZFMatrix<long_double>::~TPZFMatrix(&q);
  TPZFMatrix<long_double>::~TPZFMatrix(&ptilde);
  TPZFMatrix<long_double>::~TPZFMatrix(&p);
  TPZFMatrix<long_double>::~TPZFMatrix(&ztilde);
  TPZFMatrix<long_double>::~TPZFMatrix(&z);
  TPZFMatrix<long_double>::~TPZFMatrix(&beta);
  TPZFMatrix<long_double>::~TPZFMatrix(&alpha);
  TPZFMatrix<long_double>::~TPZFMatrix(&rho_2);
  TPZFMatrix<long_double>::~TPZFMatrix(&rho_1);
  return iVar1;
}

Assistant:

int 
BiCG( Matrix &A, Vector &x, const Vector &b,
     Preconditioner &M, int64_t &max_iter, Real &tol)
{
	Real resid;
	Vector rho_1(1), rho_2(1), alpha(1), beta(1);
	Vector z, ztilde, p, ptilde, q, qtilde;
	
	Real normb = TPZExtractVal::val(Norm(b));
	Vector r = b - A * x;
	Vector rtilde = r;
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = (TPZExtractVal::val(Norm(r)) / normb) <= tol)) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	
	for (int64_t i = 1; i <= max_iter; i++) {
		M.Solve(r,z);
		M.Solve(rtilde,ztilde);
		rho_1(0) = Dot(z, rtilde);
		if (TPZExtractVal::val(rho_1(0)) == ((Real)0.)) {
			tol = (TPZExtractVal::val(Norm(r))) / normb;
			max_iter = i;
			return 2;
		}
		if (i == 1) {
			p = z;
			ptilde = ztilde;
		} else {
			beta(0) = rho_1(0) / rho_2(0);
			p.TimesBetaPlusZ(beta(0),z);
			ptilde.TimesBetaPlusZ(beta(0),ztilde);
		}
		q = A * p;
		A.Multiply(ptilde,qtilde,1);
		alpha(0) = rho_1(0) / Dot(ptilde, q);
		x += alpha(0) * p;
		r -= alpha(0) * q;
		rtilde -= alpha(0) * qtilde;
		
		rho_2(0) = rho_1(0);
		if ((resid = (TPZExtractVal::val(Norm(r))) / normb) < tol) {
			tol = resid;
			max_iter = i;
			return 0;
		}
	}
	
	tol = resid;
	return 1;
}